

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float32_primitive_lessEquals
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_float32_t sVar2;
  sysbvm_float32_t sVar3;
  sysbvm_float32_t right;
  sysbvm_float32_t left;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar2 = sysbvm_tuple_float32_decode(*arguments);
  sVar3 = sysbvm_tuple_float32_decode(arguments[1]);
  sVar1 = sysbvm_tuple_boolean_encode((float)sVar2 <= (float)sVar3);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_lessEquals(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_float32_t left = sysbvm_tuple_float32_decode(arguments[0]);
    sysbvm_float32_t right = sysbvm_tuple_float32_decode(arguments[1]);
    return sysbvm_tuple_boolean_encode(left <= right);
}